

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_detach(DETACH_HANDLE detach)

{
  AMQP_VALUE pAVar1;
  
  if (detach != (DETACH_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(detach->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_detach(DETACH_HANDLE detach)
{
    AMQP_VALUE result;

    if (detach == NULL)
    {
        result = NULL;
    }
    else
    {
        DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach;
        result = amqpvalue_clone(detach_instance->composite_value);
    }

    return result;
}